

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O1

int saisxx_private::
    suffixsort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               T,__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> SA,long fs,
              long n,long k,bool isbwt)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var20;
  long local_50;
  
  if (fs < k) {
    plVar5 = (long *)operator_new__(-(ulong)((ulong)k >> 0x3d != 0) | k * 8);
    if (0 < k) {
      memset(plVar5,0,k * 8);
    }
    if (0 < n) {
      lVar6 = 0;
      do {
        plVar5[T._M_current[lVar6]] = plVar5[T._M_current[lVar6]] + 1;
        lVar6 = lVar6 + 1;
      } while (n != lVar6);
    }
    if (0 < k) {
      lVar6 = 0;
      lVar8 = 0;
      do {
        lVar6 = lVar6 + plVar5[lVar8];
        plVar5[lVar8] = lVar6;
        lVar8 = lVar8 + 1;
      } while (k != lVar8);
    }
    if (0 < n) {
      memset(SA._M_current,0,n * 8);
    }
    uVar14 = T._M_current[n + -1];
    if (1 < n) {
      lVar6 = n + -1;
      iVar4 = 0;
      uVar13 = uVar14;
      do {
        uVar14 = T._M_current[lVar6 + -1];
        iVar11 = 1;
        if (iVar4 + uVar13 <= uVar14) {
          iVar11 = 0;
          if (iVar4 != 0) {
            lVar8 = plVar5[uVar13];
            plVar5[uVar13] = lVar8 + -1;
            SA._M_current[lVar8 + -1] = lVar6;
            iVar11 = 0;
          }
        }
        iVar4 = iVar11;
        lVar6 = lVar6 + -1;
        uVar13 = uVar14;
      } while (0 < lVar6);
    }
    induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long*,long>
              (T,SA,plVar5,plVar5,n,k);
    operator_delete__(plVar5);
  }
  else {
    _Var20._M_current = SA._M_current + n;
    lVar6 = 0;
    if (k <= fs - k) {
      lVar6 = k;
    }
    if (0 < k) {
      memset(_Var20._M_current,0,k * 8);
    }
    if (0 < n) {
      lVar8 = 0;
      do {
        _Var20._M_current[T._M_current[lVar8]] = _Var20._M_current[T._M_current[lVar8]] + 1;
        lVar8 = lVar8 + 1;
      } while (n != lVar8);
    }
    _Var15._M_current = _Var20._M_current + lVar6;
    if (0 < k) {
      lVar6 = 0;
      lVar8 = 0;
      do {
        lVar6 = lVar6 + _Var20._M_current[lVar8];
        _Var15._M_current[lVar8] = lVar6;
        lVar8 = lVar8 + 1;
      } while (k != lVar8);
    }
    if (0 < n) {
      memset(SA._M_current,0,n * 8);
    }
    uVar14 = T._M_current[n + -1];
    if (1 < n) {
      lVar6 = n + -1;
      iVar4 = 0;
      uVar13 = uVar14;
      do {
        uVar14 = T._M_current[lVar6 + -1];
        iVar11 = 1;
        if (iVar4 + uVar13 <= uVar14) {
          iVar11 = 0;
          if (iVar4 != 0) {
            lVar8 = _Var15._M_current[uVar13];
            _Var15._M_current[uVar13] = lVar8 + -1;
            SA._M_current[lVar8 + -1] = lVar6;
            iVar11 = 0;
          }
        }
        iVar4 = iVar11;
        lVar6 = lVar6 + -1;
        uVar13 = uVar14;
      } while (0 < lVar6);
    }
    induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (T,SA,_Var20,_Var15,n,k);
  }
  if (n < 1) {
    lVar6 = 0;
  }
  else {
    lVar8 = 0;
    lVar6 = 0;
    do {
      lVar7 = SA._M_current[lVar8];
      if ((0 < lVar7) && (uVar13 = T._M_current[lVar7], uVar13 < T._M_current[lVar7 + -1])) {
        bVar3 = lVar7 + 1 < n;
        if ((lVar7 + 1 < n) && (uVar14 = T._M_current[lVar7 + 1], uVar13 == uVar14)) {
          lVar12 = lVar7 + 2;
          do {
            lVar17 = lVar12;
            if (n == lVar17) break;
            uVar14 = T._M_current[lVar17];
            lVar12 = lVar17 + 1;
          } while (uVar13 == uVar14);
          bVar3 = lVar17 < n;
        }
        if ((bVar3) && (uVar13 < uVar14)) {
          SA._M_current[lVar6] = lVar7;
          lVar6 = lVar6 + 1;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != n);
  }
  lVar7 = n >> 1;
  lVar8 = lVar7 + lVar6;
  if (0 < lVar7) {
    lVar12 = lVar6 + 1;
    if (lVar6 + 1 < lVar8) {
      lVar12 = lVar8;
    }
    memset(SA._M_current + lVar6,0,(lVar12 - lVar6) * 8);
  }
  if (1 < n) {
    uVar9 = n - 1;
    lVar12 = -n;
    iVar4 = 0;
    uVar16 = n;
    uVar14 = T._M_current[n + -1];
    do {
      lVar12 = lVar12 + 1;
      uVar13 = T._M_current[uVar9 - 1];
      iVar11 = 1;
      if ((uVar14 + iVar4 <= uVar13) && (iVar11 = 0, iVar4 != 0)) {
        *(SA._M_current + (uVar9 & 0xfffffffffffffffe) * 4 + lVar6 * 8) = uVar16 + lVar12;
        uVar16 = uVar9;
      }
      iVar4 = iVar11;
      uVar9 = uVar9 - 1;
      uVar14 = uVar13;
    } while (0 < (long)uVar9);
  }
  if (lVar6 < 1) {
    lVar12 = 0;
  }
  else {
    lVar10 = 0;
    lVar17 = 0;
    lVar12 = 0;
    local_50 = n;
    do {
      lVar1 = SA._M_current[lVar10];
      lVar2 = SA._M_current[lVar6 + (lVar1 >> 1)];
      if (lVar2 == lVar17) {
        if (lVar2 < 1) {
          lVar19 = 0;
        }
        else {
          lVar18 = 0;
          do {
            lVar19 = lVar18;
            if (T._M_current[lVar1 + lVar18] != T._M_current[local_50 + lVar18]) break;
            lVar18 = lVar18 + 1;
            lVar19 = lVar2;
          } while (lVar2 != lVar18);
        }
        if (lVar19 != lVar2) goto LAB_00164d71;
      }
      else {
LAB_00164d71:
        lVar12 = lVar12 + 1;
        lVar17 = lVar2;
        local_50 = lVar1;
      }
      SA._M_current[lVar6 + (lVar1 >> 1)] = lVar12;
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar6);
  }
  if (lVar12 < lVar6) {
    _Var20._M_current = SA._M_current + n + (fs - lVar6);
    lVar17 = lVar6 + -1;
    lVar10 = lVar17;
    if (0 < lVar7) {
      do {
        if (SA._M_current[lVar8 + -1] != 0) {
          _Var20._M_current[lVar10] = SA._M_current[lVar8 + -1] + -1;
          lVar10 = lVar10 + -1;
        }
        lVar8 = lVar8 + -1;
      } while (lVar6 < lVar8);
    }
    iVar4 = suffixsort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                      (_Var20,SA,n + fs + lVar6 * -2,lVar6,lVar12,false);
    if (iVar4 != 0) {
      return -2;
    }
    if (1 < n) {
      lVar8 = n + -1;
      uVar14 = T._M_current[n + -1];
      iVar4 = 0;
      do {
        uVar13 = T._M_current[lVar8 + -1];
        iVar11 = 1;
        if (uVar14 + iVar4 <= uVar13) {
          iVar11 = 0;
          if (iVar4 != 0) {
            _Var20._M_current[lVar17] = lVar8;
            lVar17 = lVar17 + -1;
            iVar11 = 0;
          }
        }
        lVar8 = lVar8 + -1;
        uVar14 = uVar13;
        iVar4 = iVar11;
      } while (0 < lVar8);
    }
    if (0 < lVar6) {
      lVar8 = 0;
      do {
        SA._M_current[lVar8] = _Var20._M_current[SA._M_current[lVar8]];
        lVar8 = lVar8 + 1;
      } while (lVar6 != lVar8);
    }
  }
  if (fs < k) {
    plVar5 = (long *)operator_new__(-(ulong)((ulong)k >> 0x3d != 0) | k * 8);
    if (0 < k) {
      memset(plVar5,0,k * 8);
    }
    if (0 < n) {
      lVar8 = 0;
      do {
        plVar5[T._M_current[lVar8]] = plVar5[T._M_current[lVar8]] + 1;
        lVar8 = lVar8 + 1;
      } while (n != lVar8);
    }
    if (0 < k) {
      lVar8 = 0;
      lVar7 = 0;
      do {
        lVar8 = lVar8 + plVar5[lVar7];
        plVar5[lVar7] = lVar8;
        lVar7 = lVar7 + 1;
      } while (k != lVar7);
    }
    if (n - lVar6 != 0 && lVar6 <= n) {
      memset(SA._M_current + lVar6,0,(n - lVar6) * 8);
    }
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      do {
        lVar8 = SA._M_current[lVar6 + -2];
        SA._M_current[lVar6 + -2] = 0;
        lVar7 = plVar5[T._M_current[lVar8]];
        plVar5[T._M_current[lVar8]] = lVar7 + -1;
        SA._M_current[lVar7 + -1] = lVar8;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    if (isbwt) {
      iVar4 = computeBWT<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long*,long>
                        (T,SA,plVar5,plVar5,n,k);
    }
    else {
      induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long*,long>
                (T,SA,plVar5,plVar5,n,k);
      iVar4 = 0;
    }
    operator_delete__(plVar5);
  }
  else {
    _Var20._M_current = SA._M_current + n;
    lVar8 = 0;
    if (k <= fs - k) {
      lVar8 = k;
    }
    if (0 < k) {
      memset(_Var20._M_current,0,k * 8);
    }
    if (0 < n) {
      lVar7 = 0;
      do {
        _Var20._M_current[T._M_current[lVar7]] = _Var20._M_current[T._M_current[lVar7]] + 1;
        lVar7 = lVar7 + 1;
      } while (n != lVar7);
    }
    _Var15._M_current = _Var20._M_current + lVar8;
    if (0 < k) {
      lVar8 = 0;
      lVar7 = 0;
      do {
        lVar8 = lVar8 + _Var20._M_current[lVar7];
        _Var15._M_current[lVar7] = lVar8;
        lVar7 = lVar7 + 1;
      } while (k != lVar7);
    }
    if (n - lVar6 != 0 && lVar6 <= n) {
      memset(SA._M_current + lVar6,0,(n - lVar6) * 8);
    }
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      do {
        lVar8 = SA._M_current[lVar6 + -2];
        SA._M_current[lVar6 + -2] = 0;
        lVar7 = _Var15._M_current[T._M_current[lVar8]];
        _Var15._M_current[T._M_current[lVar8]] = lVar7 + -1;
        SA._M_current[lVar7 + -1] = lVar8;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    if (isbwt) {
      iVar4 = computeBWT<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                        (T,SA,_Var20,_Var15,n,k);
      return iVar4;
    }
    induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (T,SA,_Var20,_Var15,n,k);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int
suffixsort(string_type T, sarray_type SA,
           index_type fs, index_type n, index_type k,
           bool isbwt) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type RA;
  index_type i, j, m, p, q, plen, qlen, name;
  int pidx = 0;
  bool diff;
  int c;
#ifdef _OPENMP
  int maxthreads = omp_get_max_threads();
#else
# define maxthreads 1
#endif
  char_type c0, c1;

  /* stage 1: reduce the problem by at least 1/2
     sort all the S-substrings */
  if(fs < (maxthreads * k)) {
    index_type *C, *B;
    C = new index_type[maxthreads * k];
    B = (1 < maxthreads) ? C + k : C;
    getCounts(T, C, n, k); getBuckets(C, B, k, true); /* find ends of buckets */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = 0; i < n; ++i) { SA[i] = 0; }
    for(i = n - 2, c = 0, c1 = T[n - 1]; 0 <= i; --i, c1 = c0) {
      if((c0 = T[i]) < (c1 + c)) { c = 1; }
      else if(c != 0) { SA[--B[c1]] = i + 1, c = 0; }
    }
    induceSA(T, SA, C, B, n, k);
    delete [] C;
  } else {
    sarray_type C, B;
    C = SA + n;
    B = ((1 < maxthreads) || (k <= (fs - k))) ? C + k : C;
    getCounts(T, C, n, k); getBuckets(C, B, k, true); /* find ends of buckets */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = 0; i < n; ++i) { SA[i] = 0; }
    for(i = n - 2, c = 0, c1 = T[n - 1]; 0 <= i; --i, c1 = c0) {
      if((c0 = T[i]) < (c1 + c)) { c = 1; }
      else if(c != 0) { SA[--B[c1]] = i + 1, c = 0; }
    }
    induceSA(T, SA, C, B, n, k);
  }

  /* compact all the sorted substrings into the first m items of SA
     2*m must be not larger than n (proveable) */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i, j, p, c0, c1)
  for(i = 0; i < n; ++i) {
    p = SA[i];
    if((0 < p) && (T[p - 1] > (c0 = T[p]))) {
      for(j = p + 1; (j < n) && (c0 == (c1 = T[j])); ++j) { }
      if((j < n) && (c0 < c1)) { SA[i] = ~p; }
    }
  }
  for(i = 0, m = 0; i < n; ++i) { if((p = SA[i]) < 0) { SA[m++] = ~p; } }
#else
  for(i = 0, m = 0; i < n; ++i) {
    p = SA[i];
    if((0 < p) && (T[p - 1] > (c0 = T[p]))) {
      for(j = p + 1; (j < n) && (c0 == (c1 = T[j])); ++j) { }
      if((j < n) && (c0 < c1)) { SA[m++] = p; }
    }
  }
#endif
  j = m + (n >> 1);
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
  for(i = m; i < j; ++i) { SA[i] = 0; } /* init the name array buffer */
  /* store the length of all substrings */
  for(i = n - 2, j = n, c = 0, c1 = T[n - 1]; 0 <= i; --i, c1 = c0) {
    if((c0 = T[i]) < (c1 + c)) { c = 1; }
    else if(c != 0) { SA[m + ((i + 1) >> 1)] = j - i - 1; j = i + 1; c = 0; }
  }
  /* find the lexicographic names of all substrings */
  for(i = 0, name = 0, q = n, qlen = 0; i < m; ++i) {
    p = SA[i], plen = SA[m + (p >> 1)], diff = true;
    if(plen == qlen) {
      for(j = 0; (j < plen) && (T[p + j] == T[q + j]); ++j) { }
      if(j == plen) { diff = false; }
    }
    if(diff != false) { ++name, q = p, qlen = plen; }
    SA[m + (p >> 1)] = name;
  }

  /* stage 2: solve the reduced problem
     recurse if names are not yet unique */
  if(name < m) {
    RA = SA + n + fs - m;
    for(i = m + (n >> 1) - 1, j = m - 1; m <= i; --i) {
      if(SA[i] != 0) { RA[j--] = SA[i] - 1; }
    }
    if(suffixsort(RA, SA, fs + n - m * 2, m, name, false) != 0) { return -2; }
    for(i = n - 2, j = m - 1, c = 0, c1 = T[n - 1]; 0 <= i; --i, c1 = c0) {
      if((c0 = T[i]) < (c1 + c)) { c = 1; }
      else if(c != 0) { RA[j--] = i + 1, c = 0; } /* get p1 */
    }
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = 0; i < m; ++i) { SA[i] = RA[SA[i]]; } /* get index in s */
  }

  /* stage 3: induce the result for the original problem */
  if(fs < (maxthreads * k)) {
    index_type *B, *C;
    C = new index_type[maxthreads * k];
    B = (1 < maxthreads) ? C + k : C;
    /* put all left-most S characters into their buckets */
    getCounts(T, C, n, k); getBuckets(C, B, k, true); /* find ends of buckets */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = m; i < n; ++i) { SA[i] = 0; } /* init SA[m..n-1] */
    for(i = m - 1; 0 <= i; --i) {
      j = SA[i], SA[i] = 0;
      SA[--B[T[j]]] = j;
    }
    if(isbwt == false) { induceSA(T, SA, C, B, n, k); }
    else { pidx = computeBWT(T, SA, C, B, n, k); }
    delete [] C;
  } else {
    sarray_type C, B;
    C = SA + n;
    B = ((1 < maxthreads) || (k <= (fs - k))) ? C + k : C;
    /* put all left-most S characters into their buckets */
    getCounts(T, C, n, k); getBuckets(C, B, k, true); /* find ends of buckets */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = m; i < n; ++i) { SA[i] = 0; } /* init SA[m..n-1] */
    for(i = m - 1; 0 <= i; --i) {
      j = SA[i], SA[i] = 0;
      SA[--B[T[j]]] = j;
    }
    if(isbwt == false) { induceSA(T, SA, C, B, n, k); }
    else { pidx = computeBWT(T, SA, C, B, n, k); }
  }

  return pidx;
#ifndef _OPENMP
# undef maxthreads
#endif
}